

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::Clear(FileOptions *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  FileOptions *pFStack_18;
  uint32_t cached_has_bits;
  FileOptions *this_local;
  
  this_local = (FileOptions *)&this->field_0;
  local_1c = 0;
  pFStack_18 = this;
  internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear
            (&(this->field_0)._impl_.uninterpreted_option_);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0xff) != 0) {
    if ((local_1c & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.java_package_);
    }
    if ((local_1c & 2) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.java_outer_classname_);
    }
    if ((local_1c & 4) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.go_package_);
    }
    if ((local_1c & 8) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.objc_class_prefix_);
    }
    if ((local_1c & 0x10) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.csharp_namespace_);
    }
    if ((local_1c & 0x20) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.swift_prefix_);
    }
    if ((local_1c & 0x40) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.php_class_prefix_);
    }
    if ((local_1c & 0x80) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.php_namespace_);
    }
  }
  if ((local_1c & 0x700) != 0) {
    if ((local_1c & 0x100) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.php_metadata_namespace_);
    }
    if ((local_1c & 0x200) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.ruby_package_);
    }
    if ((local_1c & 0x400) != 0) {
      if ((this->field_0)._impl_.features_ == (FeatureSet *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x20b6,"_impl_.features_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      FeatureSet::Clear((this->field_0)._impl_.features_);
    }
  }
  if ((local_1c & 0xf800) != 0) {
    memset((void *)((long)&this->field_0 + 0x90),0,5);
  }
  if ((local_1c & 0xf0000) != 0) {
    memset((void *)((long)&this->field_0 + 0x95),0,2);
    (this->field_0)._impl_.optimize_for_ = 1;
    (this->field_0)._impl_.cc_enable_arenas_ = true;
  }
  internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FileOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileOptions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.uninterpreted_option_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.java_package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.java_outer_classname_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.go_package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.objc_class_prefix_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _impl_.csharp_namespace_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _impl_.swift_prefix_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _impl_.php_class_prefix_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _impl_.php_namespace_.ClearNonDefaultToEmpty();
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _impl_.php_metadata_namespace_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _impl_.ruby_package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(_impl_.features_ != nullptr);
      _impl_.features_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000f800u) != 0) {
    ::memset(&_impl_.java_multiple_files_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.java_generate_equals_and_hash_) -
        reinterpret_cast<char*>(&_impl_.java_multiple_files_)) + sizeof(_impl_.java_generate_equals_and_hash_));
  }
  if ((cached_has_bits & 0x000f0000u) != 0) {
    ::memset(&_impl_.deprecated_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.java_string_check_utf8_) -
        reinterpret_cast<char*>(&_impl_.deprecated_)) + sizeof(_impl_.java_string_check_utf8_));
    _impl_.optimize_for_ = 1;
    _impl_.cc_enable_arenas_ = true;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}